

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStore.h
# Opt level: O0

void __thiscall FIX::FileStoreFactory::FileStoreFactory(FileStoreFactory *this,string *path)

{
  string *path_local;
  FileStoreFactory *this_local;
  
  MessageStoreFactory::MessageStoreFactory((MessageStoreFactory *)this);
  *(code **)this = std::logic_error::logic_error;
  std::__cxx11::string::string((string *)(this + 8),(string *)path);
  SessionSettings::SessionSettings((SessionSettings *)(this + 0x28));
  return;
}

Assistant:

FileStoreFactory(const std::string &path)
      : m_path(path) {}